

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9ReadCBlif(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  Gia_Man_t *pNew;
  char *pcVar2;
  uint local_64;
  int fVerbose;
  int c;
  int nArgcNew;
  char *pModelName;
  char *pTemp;
  char *FileName;
  char **pArgvNew;
  FILE *pFile;
  Gia_Man_t *pAig;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _c = (char *)0x0;
  local_64 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Mvh");
      if (iVar1 == -1) {
        if (argc - globalUtilOptind == 1) {
          pcVar2 = argv[globalUtilOptind];
          for (pModelName = pcVar2; *pModelName != '\0'; pModelName = pModelName + 1) {
            if (*pModelName == '>') {
              *pModelName = '\\';
            }
          }
          __stream = fopen(pcVar2,"r");
          if (__stream == (FILE *)0x0) {
            Abc_Print(-1,"Cannot open input file \"%s\". ",pcVar2);
            pcVar2 = Extra_FileGetSimilarName
                               (pcVar2,".cblif",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
            if (pcVar2 != (char *)0x0) {
              Abc_Print(1,"Did you mean \"%s\"?",pcVar2);
            }
            Abc_Print(1,"\n");
            pAbc_local._4_4_ = 1;
          }
          else {
            fclose(__stream);
            pNew = Abc_NtkHieCecTest2(pcVar2,_c,local_64);
            Abc_FrameUpdateGia(pAbc,pNew);
            pAbc_local._4_4_ = 0;
          }
        }
        else {
          Abc_Print(-1,"There is no file name.\n");
          pAbc_local._4_4_ = 1;
        }
        return pAbc_local._4_4_;
      }
      if (iVar1 == 0x4d) break;
      if (iVar1 != 0x76) goto LAB_00259604;
      local_64 = local_64 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    _c = argv[globalUtilOptind];
    globalUtilOptind = globalUtilOptind + 1;
  }
  Abc_Print(-1,"Command line switch \"-M\" should be followed by a file name.\n");
LAB_00259604:
  Abc_Print(-2,"usage: &read_cblif [-M name] [-vh] <file>\n");
  Abc_Print(-2,"\t         reads CBLIF file and collapse it into an AIG\n");
  Abc_Print(-2,"\t-M name: module name to collapse [default = <root_module>]\n");
  pcVar2 = "no";
  if (local_64 != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggles additional verbose output [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t<file> : the file name\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9ReadCBlif( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Abc_NtkHieCecTest2( char * pFileName, char * pModelName, int fVerbose );
    Gia_Man_t * pAig;
    FILE * pFile;
    char ** pArgvNew;
    char * FileName, * pTemp;
    char * pModelName = NULL;
    int nArgcNew;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Mvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by a file name.\n" );
                goto usage;
            }
            pModelName = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }
    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if ( nArgcNew != 1 )
    {
        Abc_Print( -1, "There is no file name.\n" );
        return 1;
    }

    // get the input file name
    FileName = pArgvNew[0];
    // fix the wrong symbol
    for ( pTemp = FileName; *pTemp; pTemp++ )
        if ( *pTemp == '>' )
            *pTemp = '\\';
    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        Abc_Print( -1, "Cannot open input file \"%s\". ", FileName );
        if ( (FileName = Extra_FileGetSimilarName( FileName, ".cblif", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", FileName );
        Abc_Print( 1, "\n" );
        return 1;
    }
    fclose( pFile );

    pAig = Abc_NtkHieCecTest2( FileName, pModelName, fVerbose );
    Abc_FrameUpdateGia( pAbc, pAig );
    return 0;

usage:
    Abc_Print( -2, "usage: &read_cblif [-M name] [-vh] <file>\n" );
    Abc_Print( -2, "\t         reads CBLIF file and collapse it into an AIG\n" );
    Abc_Print( -2, "\t-M name: module name to collapse [default = <root_module>]\n" );
    Abc_Print( -2, "\t-v     : toggles additional verbose output [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : the file name\n");
    return 1;
}